

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O0

void mathCore::dual(expression *a)

{
  bool bVar1;
  expression *a_local;
  
  bVar1 = is_literal(a);
  if (bVar1) {
    negate(a);
  }
  else {
    bVar1 = is_var(a);
    if (!bVar1) {
      a->FLAGS = a->FLAGS ^ 8;
    }
  }
  return;
}

Assistant:

void mathCore::dual(expression* a) {
	if (mathCore::is_literal(a)) {
		// Dual of a Literal is its negation
		mathCore::negate(a);
	}
	else if (!mathCore::is_var(a)){
		// If its not a varible you flip its dual
		a->FLAGS ^= F_DUAL;
	}
}